

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool ReadObject(HSQUIRRELVM v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *o)

{
  SQSharedState *this;
  SQObjectValue SVar1;
  bool bVar2;
  SQChar *pSVar3;
  SQString *x;
  SQInteger len;
  SQUnsignedInteger32 _type;
  
  bVar2 = SafeRead(v,read,up,&_type,4);
  if (bVar2) {
    if (_type == 0x1000001) {
      SQObjectPtr::Null(o);
      return true;
    }
    if (_type == 0x1000008) {
      bVar2 = SafeRead(v,read,up,&len,8);
      if (bVar2) {
        (o->super_SQObject)._type = OT_BOOL;
        SVar1.nInteger._4_4_ = len._4_4_;
        SVar1.fFloat = (SQFloat)len;
        (o->super_SQObject)._unVal = SVar1;
        return true;
      }
    }
    else if (_type == 0x5000002) {
      bVar2 = SafeRead(v,read,up,&len,8);
      if (bVar2) {
        SQObjectPtr::operator=(o,CONCAT44(len._4_4_,(SQFloat)len));
        return true;
      }
    }
    else if (_type == 0x5000004) {
      bVar2 = SafeRead(v,read,up,&len,4);
      if (bVar2) {
        SQObjectPtr::operator=(o,(SQFloat)len);
        return true;
      }
    }
    else {
      if (_type != 0x8000010) {
        pSVar3 = IdType2Name(_type);
        SQVM::Raise_Error(v,"cannot serialize a %s",pSVar3);
        return false;
      }
      bVar2 = SafeRead(v,read,up,&len,8);
      if (bVar2) {
        pSVar3 = SQSharedState::GetScratchPad(v->_sharedstate,CONCAT44(len._4_4_,(SQFloat)len));
        bVar2 = SafeRead(v,read,up,pSVar3,CONCAT44(len._4_4_,(SQFloat)len));
        if (bVar2) {
          this = v->_sharedstate;
          pSVar3 = SQSharedState::GetScratchPad(this,-1);
          x = SQString::Create(this,pSVar3,CONCAT44(len._4_4_,(SQFloat)len));
          SQObjectPtr::operator=(o,x);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ReadObject(HSQUIRRELVM v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &o)
{
    SQUnsignedInteger32 _type;
    _CHECK_IO(SafeRead(v,read,up,&_type,sizeof(_type)));
    SQObjectType t = (SQObjectType)_type;
    switch(t){
    case OT_STRING:{
        SQInteger len;
        _CHECK_IO(SafeRead(v,read,up,&len,sizeof(SQInteger)));
        _CHECK_IO(SafeRead(v,read,up,_ss(v)->GetScratchPad(sq_rsl(len)),sq_rsl(len)));
        o=SQString::Create(_ss(v),_ss(v)->GetScratchPad(-1),len);
                   }
        break;
    case OT_INTEGER:{
        SQInteger i;
        _CHECK_IO(SafeRead(v,read,up,&i,sizeof(SQInteger))); o = i; break;
                    }
    case OT_BOOL:{
        SQInteger i;
        _CHECK_IO(SafeRead(v,read,up,&i,sizeof(SQInteger))); o._type = OT_BOOL; o._unVal.nInteger = i; break;
                    }
    case OT_FLOAT:{
        SQFloat f;
        _CHECK_IO(SafeRead(v,read,up,&f,sizeof(SQFloat))); o = f; break;
                  }
    case OT_NULL:
        o.Null();
        break;
    default:
        v->Raise_Error(_SC("cannot serialize a %s"),IdType2Name(t));
        return false;
    }
    return true;
}